

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O0

void charls::transform_line<charls::transform_hp2<unsigned_char>,unsigned_char>
               (quad<unsigned_char> *destination,quad<unsigned_char> *source,size_t pixel_count,
               transform_hp2<unsigned_char> *transform,uint32_t mask)

{
  triplet<unsigned_char> triplet_value;
  quad<unsigned_char> local_3c;
  transform_hp2<unsigned_char> *local_38;
  size_t i;
  transform_hp2<unsigned_char> *ptStack_28;
  uint32_t mask_local;
  transform_hp2<unsigned_char> *transform_local;
  size_t pixel_count_local;
  quad<unsigned_char> *source_local;
  quad<unsigned_char> *destination_local;
  
  i._4_4_ = mask;
  ptStack_28 = transform;
  transform_local = (transform_hp2<unsigned_char> *)pixel_count;
  pixel_count_local = (size_t)source;
  source_local = destination;
  for (local_38 = (transform_hp2<unsigned_char> *)0x0; local_38 < transform_local;
      local_38 = local_38 + 1) {
    triplet_value =
         transform_hp2<unsigned_char>::operator()
                   (ptStack_28,*(byte *)(pixel_count_local + (long)local_38 * 4) & i._4_4_,
                    *(byte *)(pixel_count_local + 1 + (long)local_38 * 4) & i._4_4_,
                    *(byte *)(pixel_count_local + 2 + (long)local_38 * 4) & i._4_4_);
    quad<unsigned_char>::quad
              (&local_3c,triplet_value,
               *(byte *)(pixel_count_local + 3 + (long)local_38 * 4) & i._4_4_);
    source_local[(long)local_38] = local_3c;
  }
  return;
}

Assistant:

void transform_line(quad<PixelType>* destination, const quad<PixelType>* source, const size_t pixel_count,
                    Transform& transform, const uint32_t mask) noexcept
{
    for (size_t i{}; i < pixel_count; ++i)
    {
        destination[i] =
            quad<PixelType>(transform(source[i].v1 & mask, source[i].v2 & mask, source[i].v3 & mask), source[i].v4 & mask);
    }
}